

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metaf.hpp
# Opt level: O0

Group * metaf::GroupParser::parseAlternative<14ul>
                  (string *group,ReportPart reportPart,ReportMetadata *reportMetadata)

{
  bool bVar1;
  Group *in_RDI;
  optional<metaf::LayerForecastGroup> parsed;
  ReportMetadata *in_stack_00000110;
  ReportPart in_stack_0000011c;
  string *in_stack_00000120;
  LayerForecastGroup *in_stack_ffffffffffffffa8;
  Group *this;
  ReportMetadata *in_stack_ffffffffffffffd0;
  ReportPart in_stack_ffffffffffffffdc;
  string *in_stack_ffffffffffffffe0;
  
  this = in_RDI;
  LayerForecastGroup::parse(in_stack_00000120,in_stack_0000011c,in_stack_00000110);
  bVar1 = std::optional<metaf::LayerForecastGroup>::has_value
                    ((optional<metaf::LayerForecastGroup> *)0x26757e);
  if (bVar1) {
    std::optional<metaf::LayerForecastGroup>::operator*
              ((optional<metaf::LayerForecastGroup> *)0x26758e);
    std::
    variant<metaf::KeywordGroup,metaf::LocationGroup,metaf::ReportTimeGroup,metaf::TrendGroup,metaf::WindGroup,metaf::VisibilityGroup,metaf::CloudGroup,metaf::WeatherGroup,metaf::TemperatureGroup,metaf::PressureGroup,metaf::RunwayStateGroup,metaf::SeaSurfaceGroup,metaf::MinMaxTemperatureGroup,metaf::PrecipitationGroup,metaf::LayerForecastGroup,metaf::PressureTendencyGroup,metaf::CloudTypesGroup,metaf::LowMidHighCloudGroup,metaf::LightningGroup,metaf::VicinityGroup,metaf::MiscGroup,metaf::UnknownGroup>
    ::variant<metaf::LayerForecastGroup_const&,void,void,metaf::LayerForecastGroup,void>
              (this,in_stack_ffffffffffffffa8);
  }
  else {
    parseAlternative<15ul>
              (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd0);
  }
  return in_RDI;
}

Assistant:

static Group parseAlternative(const std::string & group,
		ReportPart reportPart,
		const ReportMetadata & reportMetadata)
	{
		using Alternative = std::variant_alternative_t<I, Group>;
		if constexpr (!std::is_same<Alternative, FallbackGroup>::value) {
			const auto parsed = Alternative::parse(group, reportPart, reportMetadata);
			if (parsed.has_value()) return *parsed;
		}
		if constexpr (I >= (std::variant_size_v<Group> - 1)) {
			return FallbackGroup();
		} else {
			return parseAlternative<I+1>(group, reportPart, reportMetadata);
		}
	}